

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

bool __thiscall kj::UnixEventPort::processEpollEvents(UnixEventPort *this,epoll_event *events,int n)

{
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 __fd;
  FdObserver *this_00;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ssize_t sVar4;
  TimePoint newTime;
  ulong uVar5;
  Fault f;
  Fault f_1;
  uint64_t value;
  Fault local_68;
  undefined4 local_5c;
  Fault local_58;
  undefined8 uStack_50;
  Fault local_48;
  undefined8 uStack_40;
  undefined4 extraout_var;
  
  if (n < 1) {
    local_5c = 0;
  }
  else {
    uVar5 = 0;
    local_5c = 0;
    do {
      this_00 = (FdObserver *)events[uVar5].data.ptr;
      if (this_00 == (FdObserver *)0x1) {
        if ((this->timerFd).ptr.isSet == false) {
          local_48.exception = (Exception *)0x0;
          local_58.exception = (Exception *)0x0;
          uStack_50 = 0;
          kj::_::Debug::Fault::init
                    (&local_48,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_48);
        }
        __fd = (this->timerFd).ptr.field_1;
        local_48.exception = (Exception *)0x0;
        uStack_40 = 0;
        do {
          sVar4 = read((int)__fd,&local_48,0x10);
          if (-1 < sVar4) {
            local_68.exception._0_1_ = sVar4 == 8;
            if (sVar4 != 8) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                        (&local_58,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                         ,0x291,FAILED,"n == 8 || n < 0","_kjCondition,",(bool *)&local_68);
              kj::_::Debug::Fault::fatal(&local_58);
            }
            goto LAB_0049a9e6;
          }
          iVar2 = kj::_::Debug::getOsErrorNumber(true);
        } while (iVar2 == -1);
        if (iVar2 != 0) {
          local_68.exception = (Exception *)0x0;
          local_58.exception = (Exception *)0x0;
          uStack_50 = 0;
          kj::_::Debug::Fault::init
                    (&local_68,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_68);
        }
LAB_0049a9e6:
        this->timerfdIsArmed = false;
      }
      else if (this_00 == (FdObserver *)0x0) {
        do {
          uVar3 = read((this->eventFd).fd,&local_48,8);
          if (-1 < (long)uVar3) {
            local_68.exception._0_1_ = uVar3 == 8;
            if (uVar3 != 8) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                        (&local_58,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                         ,0x287,FAILED,"n < 0 || n == sizeof(value)","_kjCondition,",
                         (bool *)&local_68);
              kj::_::Debug::Fault::fatal(&local_58);
            }
            goto LAB_0049a9cf;
          }
          uVar1 = kj::_::Debug::getOsErrorNumber(true);
          uVar3 = (ulong)uVar1;
        } while (uVar1 == 0xffffffff);
        if (uVar1 != 0) {
          local_68.exception = (Exception *)0x0;
          local_58.exception = (Exception *)0x0;
          uStack_50 = 0;
          kj::_::Debug::Fault::init
                    (&local_68,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_68);
        }
LAB_0049a9cf:
        local_5c = (undefined4)CONCAT71((int7)(uVar3 >> 8),1);
      }
      else {
        FdObserver::fire(this_00,(short)events[uVar5].events);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)n);
  }
  newTime.value.value._0_4_ = (**this->clock->_vptr_MonotonicClock)();
  newTime.value.value._4_4_ = extraout_var;
  TimerImpl::advanceTo(&this->timerImpl,newTime);
  return (bool)((byte)local_5c & 1);
}

Assistant:

bool UnixEventPort::processEpollEvents(struct epoll_event events[], int n) {
  bool woken = false;

  for (int i = 0; i < n; i++) {
    if (events[i].data.u64 == 0) {
      // Someone called wake() from another thread. Consume the event.
      uint64_t value;
      ssize_t n;
      KJ_NONBLOCKING_SYSCALL(n = read(eventFd, &value, sizeof(value)));
      KJ_ASSERT(n < 0 || n == sizeof(value));

      // We were woken. Need to return true.
      woken = true;
    } else if (events[i].data.u64 == 1) {
      // timerfd fired. We need to clear it by reading it.
      int tfd = KJ_ASSERT_NONNULL(timerFd).get();
      char buffer[16]{};
      ssize_t n;
      KJ_NONBLOCKING_SYSCALL(n = read(tfd, buffer, sizeof(buffer)));
      KJ_ASSERT(n == 8 || n < 0);

      timerfdIsArmed = false;

      // The purpose of this event is just to wake up the event loop when needed. We'll check the
      // timer queue separately, so we don't need to do anything special in response to this event
      // here.
    } else {
      FdObserver* observer = reinterpret_cast<FdObserver*>(events[i].data.ptr);
      observer->fire(events[i].events);
    }
  }

  timerImpl.advanceTo(clock.now());

  return woken;
}